

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendStamp.hpp
# Opt level: O0

void __thiscall
OpenMD::BendStamp::setMembers(BendStamp *this,vector<int,_std::allocator<int>_> *members)

{
  size_type sVar1;
  ostream *poVar2;
  OpenMDException *this_00;
  string *msg;
  undefined8 uVar3;
  long in_RDI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [16];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe88;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe90;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  
  std::vector<int,_std::allocator<int>_>::operator=
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98));
  if (1 < sVar1) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98));
    if (sVar1 < 4) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"members");
  containerToString<std::vector<int,std::allocator<int>>>(in_stack_ffffffffffffff98);
  this_00 = (OpenMDException *)std::operator<<(poVar2,local_1b8);
  msg = (string *)std::operator<<((ostream *)this_00," is invalid");
  std::ostream::operator<<(msg,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1b8);
  uVar3 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(this_00,msg);
  __cxa_throw(uVar3,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void setMembers(const std::vector<int>& members) {
      members_ = members;
      if (members_.size() < 2 || members_.size() > 3) {
        std::ostringstream oss;
        oss << "members" << containerToString(members) << " is invalid"
            << std::endl;
        throw OpenMDException(oss.str());
      }
    }